

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::setSpecConstantId
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,int value)

{
  bool bVar1;
  int value_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if (value < 0x7ff) {
    *(ulong *)&qualifier->field_0x24 =
         *(ulong *)&qualifier->field_0x24 & 0xfff800ffffffffff |
         ((ulong)(uint)value & 0x7ff) << 0x28;
    *(ulong *)&qualifier->field_0x8 =
         *(ulong *)&qualifier->field_0x8 & 0xfffffffeffffffff | 0x100000000;
    bVar1 = TIntermediate::addUsedConstantId
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,value);
    if (!bVar1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"specialization-constant id already used","constant_id","");
    }
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"specialization-constant id is too large","constant_id","");
  }
  return;
}

Assistant:

void HlslParseContext::setSpecConstantId(const TSourceLoc& loc, TQualifier& qualifier, int value)
{
    if (value >= (int)TQualifier::layoutSpecConstantIdEnd) {
        error(loc, "specialization-constant id is too large", "constant_id", "");
    } else {
        qualifier.layoutSpecConstantId = value;
        qualifier.specConstant = true;
        if (! intermediate.addUsedConstantId(value))
            error(loc, "specialization-constant id already used", "constant_id", "");
    }
    return;
}